

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

uint FSE_minTableLog(size_t srcSize,uint maxSymbolValue)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (uint)srcSize;
  if ((uVar2 != 0) && (maxSymbolValue != 0)) {
    if (1 < srcSize) {
      uVar1 = 0x1f;
      if (maxSymbolValue != 0) {
        for (; maxSymbolValue >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
      uVar2 = (uVar1 ^ 0xffffffe0) + 0x22;
      if (uVar3 < uVar2) {
        uVar2 = uVar3;
      }
      return uVar2;
    }
    __assert_fail("srcSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x167c,"unsigned int FSE_minTableLog(size_t, unsigned int)");
  }
  __assert_fail("val != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5a1,"unsigned int BIT_highbit32(U32)");
}

Assistant:

static unsigned FSE_minTableLog(size_t srcSize, unsigned maxSymbolValue)
{
    U32 minBitsSrc = BIT_highbit32((U32)(srcSize)) + 1;
    U32 minBitsSymbols = BIT_highbit32(maxSymbolValue) + 2;
    U32 minBits = minBitsSrc < minBitsSymbols ? minBitsSrc : minBitsSymbols;
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    return minBits;
}